

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O2

void __thiscall
ExchangeCompilation_MissingTriple_Test::TestBody(ExchangeCompilation_MissingTriple_Test *this)

{
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  database *db;
  char *message;
  error_code eVar1;
  mock_mutex mutex;
  AssertHelper local_1d0;
  error_code local_1c8;
  AssertionResult gtest_ar;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  digest compilation_digest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> compilation;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  string_mapping imported_names;
  
  s_abi_cxx11_(&compilation,"{ \"definitions\": [] }",0x15);
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  compilation_digest.v_._0_8_ = 0x9abcdef0;
  compilation_digest.v_._8_8_ = 0x12345678;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&compilation_parser,&mutex);
  db = &(this->super_ExchangeCompilation).import_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,db,(lock_type *)&compilation_parser);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&compilation_parser);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&fragment_index,db,true);
  anon_unknown.dwarf_9d963::import_compilation_parser
            (&compilation_parser,&transaction,&imported_names,&fragment_index,&compilation_digest);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      (&compilation_parser,&compilation);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  eVar1 = pstore::exchange::import_ns::make_error_code(incomplete_compilation_object);
  local_1c8._M_cat = eVar1._M_cat;
  local_1c8._M_value = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"compilation_parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object)",
             &compilation_parser.error_,&local_1c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if ((long *)CONCAT44(local_1c8._4_4_,local_1c8._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1c8._4_4_,local_1c8._M_value) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&compilation_parser);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fragment_index.
              super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  std::__cxx11::string::~string((string *)&compilation);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingTriple) {
    auto const compilation = R"({ "definitions": [] })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}